

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMuluMusashi<(moira::Core)2,(moira::Instr)82,(moira::Mode)0,2>
          (Moira *this,u16 opcode)

{
  ushort uVar1;
  u32 uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(opcode >> 9 & 7);
  uVar1 = *(ushort *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  this->readBuffer = (u16)uVar2;
  iVar3 = (uint)*(ushort *)((long)&(this->reg).field_3 + uVar4 * 4) * (uint)uVar1;
  (this->reg).sr.n = SUB41((uint)iVar3 >> 0x1f,0);
  (this->reg).sr.z = iVar3 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(int *)((long)&(this->reg).field_3 + uVar4 * 4) = iVar3;
  return;
}

Assistant:

void
Moira::execMuluMusashi(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    readOp<C, M, Word>(src, &ea, &data);

    prefetch<C, POLL>();
    result = mulu<C>(data, readD<Word>(dst));

    if constexpr (I == Instr::MULU) { SYNC_68000(50); SYNC_68010(26); }
    if constexpr (I == Instr::MULS) { SYNC_68000(50); SYNC_68010(28); }

    writeD(dst, result);
}